

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O3

Point * MeshLib::Trait::getConformal(Point *__return_storage_ptr__,string *s)

{
  double pz;
  double py;
  string subs;
  char line [1024];
  double local_458;
  double local_450;
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 local_428 [1032];
  
  std::__cxx11::string::find((char *)s,0x114832,0);
  std::__cxx11::string::substr((ulong)local_448,(ulong)s);
  __isoc99_sscanf(local_448[0],"conformal=(%lf %lf %lf)%s",__return_storage_ptr__,&local_450,
                  &local_458,local_428);
  __return_storage_ptr__->v[1] = local_450;
  __return_storage_ptr__->v[2] = local_458;
  if (local_448[0] != local_438) {
    operator_delete(local_448[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Point Trait::getConformal(std::string s)
{
	std::string::size_type pos = s.find ("conformal");
	std::string subs = s.substr (pos);
	double px, py, pz;
	char line[1024];
	sscanf(subs.c_str (),"conformal=(%lf %lf %lf)%s",&px,&py,&pz,line);
	return Point(px,py,pz);
}